

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

AggregateFunction *
duckdb::
GetGenericArgMinMaxFunction<duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)2,duckdb::GenericArgMinMaxState<(duckdb::OrderType)2>>>
          (void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  AggregateFunction *in_RDI;
  aggregate_destructor_t unaff_retaddr;
  aggregate_statistics_t in_stack_00000008;
  aggregate_window_t in_stack_00000010;
  aggregate_serialize_t in_stack_00000018;
  aggregate_deserialize_t in_stack_00000020;
  allocator_type *in_stack_fffffffffffffec8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffed0;
  iterator in_stack_fffffffffffffed8;
  size_type in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  LogicalTypeId id;
  LogicalType *in_stack_fffffffffffffef0;
  undefined1 **local_b8;
  aggregate_update_t in_stack_ffffffffffffff78;
  aggregate_initialize_t in_stack_ffffffffffffff80;
  aggregate_size_t in_stack_ffffffffffffff88;
  LogicalType *in_stack_ffffffffffffff90;
  vector<duckdb::LogicalType,_true> *arguments;
  AggregateFunction *in_stack_ffffffffffffffa0;
  vector<duckdb::LogicalType,_true> local_48;
  undefined1 *local_30;
  undefined8 local_28;
  aggregate_combine_t in_stack_ffffffffffffffe0;
  aggregate_finalize_t in_stack_ffffffffffffffe8;
  aggregate_simple_update_t in_stack_fffffffffffffff0;
  AggregateFunction *bind;
  
  id = (LogicalTypeId)((ulong)in_stack_fffffffffffffee8 >> 0x38);
  bind = in_RDI;
  LogicalType::LogicalType(in_stack_fffffffffffffef0,id);
  arguments = &local_48;
  LogicalType::LogicalType(in_stack_fffffffffffffef0,id);
  local_30 = &stack0xffffffffffffffa0;
  local_28 = 2;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x1b9cdcb);
  iVar1._M_len = in_stack_fffffffffffffee0;
  iVar1._M_array = in_stack_fffffffffffffed8;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffed0,iVar1,in_stack_fffffffffffffec8);
  LogicalType::LogicalType(in_stack_fffffffffffffef0,id);
  AggregateFunction::AggregateFunction
            (in_stack_ffffffffffffffa0,arguments,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
             ,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffe8,in_stack_fffffffffffffff0,(bind_aggregate_function_t)bind,
             unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020);
  LogicalType::~LogicalType((LogicalType *)0x1b9cea5);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1b9ceb2);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x1b9cebf);
  local_b8 = &local_30;
  do {
    local_b8 = local_b8 + -3;
    LogicalType::~LogicalType((LogicalType *)0x1b9ceee);
  } while (local_b8 != (undefined1 **)&stack0xffffffffffffffa0);
  return in_RDI;
}

Assistant:

AggregateFunction GetGenericArgMinMaxFunction() {
	using STATE = ArgMinMaxState<string_t, string_t>;
	return AggregateFunction(
	    {LogicalType::ANY, LogicalType::ANY}, LogicalType::ANY, AggregateFunction::StateSize<STATE>,
	    AggregateFunction::StateInitialize<STATE, OP, AggregateDestructorType::LEGACY>, OP::template Update<STATE>,
	    AggregateFunction::StateCombine<STATE, OP>, AggregateFunction::StateVoidFinalize<STATE, OP>, nullptr, OP::Bind,
	    AggregateFunction::StateDestroy<STATE, OP>);
}